

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O2

int __thiscall EventPlayer::init(EventPlayer *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  
  this->playerBufferPosition = 0;
  this->playerCurrentValue = 0;
  this->playerNextValue = 0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  stochCurrentValue = 0.0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  stochNextValue = 0.0;
  return in_EAX;
}

Assistant:

void EventPlayer::init()
{
	playerBufferPosition = 0;
	playerCurrentValue = 0;
	playerNextValue = 0;
	stochCurrentValue = 0.0;
	stochNextValue = 0.0;
	StochasticEventGenerator::init();
}